

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.hpp
# Opt level: O0

void __thiscall OpenMD::Cuboctahedron::~Cuboctahedron(Cuboctahedron *this)

{
  Cuboctahedron *in_RDI;
  
  ~Cuboctahedron(in_RDI);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

virtual ~Cuboctahedron() = default;